

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_parser.c
# Opt level: O0

_Bool parse_PRG_rom(uint8_t *rom_data)

{
  uint8_t *puVar1;
  uint local_38;
  byte local_33;
  ushort local_32;
  uint32_t rom_address;
  uint8_t bank_num_1;
  uint16_t bank_address;
  uint8_t *bank_to_fill;
  uint32_t bank_ending_rom_address;
  uint32_t bank_starting_rom_address;
  uint8_t bank_num;
  uint8_t *rom_data_local;
  
  PRG_rom_banks = (uint8_t **)malloc((ulong)parsed_header.PRG_ROM_chunks << 3);
  if (PRG_rom_banks == (uint8_t **)0x0) {
    printf("ERROR: Failed to malloc pointers for PRG_ROM banks\n");
    rom_data_local._7_1_ = true;
  }
  else {
    for (bank_ending_rom_address._3_1_ = 0;
        bank_ending_rom_address._3_1_ < parsed_header.PRG_ROM_chunks;
        bank_ending_rom_address._3_1_ = bank_ending_rom_address._3_1_ + 1) {
      puVar1 = (uint8_t *)malloc(0x4000);
      PRG_rom_banks[bank_ending_rom_address._3_1_] = puVar1;
      if (PRG_rom_banks[bank_ending_rom_address._3_1_] == (uint8_t *)0x0) {
        printf("ERROR: Failed to malloc space for PRG_ROM bank\n");
        return true;
      }
    }
    for (local_33 = 0; local_33 < parsed_header.PRG_ROM_chunks; local_33 = local_33 + 1) {
      puVar1 = PRG_rom_banks[local_33];
      local_32 = 0;
      for (local_38 = (uint)local_33 * 0x4000 + 0x10; local_38 < (local_33 + 1) * 0x4000 + 0x10;
          local_38 = local_38 + 1) {
        puVar1[local_32] = rom_data[local_38];
        local_32 = local_32 + 1;
      }
    }
    rom_data_local._7_1_ = false;
  }
  return rom_data_local._7_1_;
}

Assistant:

bool parse_PRG_rom(uint8_t* rom_data) {
    PRG_rom_banks = malloc(parsed_header.PRG_ROM_chunks * sizeof(uint8_t*));
    if(PRG_rom_banks == NULL) {
        printf("ERROR: Failed to malloc pointers for PRG_ROM banks\n");
        return true;
    }

    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        PRG_rom_banks[bank_num] = malloc(PRG_BANK_SIZE * sizeof(uint8_t));
        if(PRG_rom_banks[bank_num] == NULL) {
            printf("ERROR: Failed to malloc space for PRG_ROM bank\n");
            return true;
        }
    }

    uint32_t bank_starting_rom_address;
    uint32_t bank_ending_rom_address;
    uint8_t* bank_to_fill;
    uint16_t bank_address;
    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        bank_starting_rom_address = GAME_DATA_START + (PRG_BANK_SIZE * bank_num);
        bank_ending_rom_address   = GAME_DATA_START + (PRG_BANK_SIZE * (bank_num + 1));
        bank_to_fill              = PRG_rom_banks[bank_num];
        bank_address              = 0;

        for(uint32_t rom_address = bank_starting_rom_address; rom_address < bank_ending_rom_address; rom_address++) {
            bank_to_fill[bank_address++] = rom_data[rom_address];
        }
    }

    return false;
}